

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O0

int __thiscall AtomicFile::impl::close(impl *this,int __fd)

{
  int iVar1;
  impl *this_local;
  
  File::close(&this->temp_file,__fd);
  iVar1 = File::close(&this->real_file,__fd);
  return iVar1;
}

Assistant:

void AtomicFile::impl::close ()
{
  try
  {
    temp_file.close ();
    real_file.close ();
  }
  catch (...)
  {
    allow_atomics = false;
    throw;
  }
}